

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_compress.hpp
# Opt level: O2

void __thiscall
duckdb::AlpRDCompressionState<double>::Append
          (AlpRDCompressionState<double> *this,UnifiedVectorFormat *vdata,idx_t count)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  EXACT_TYPE EVar3;
  SelectionVector *pSVar4;
  long lVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t iVar9;
  idx_t i;
  long lVar10;
  idx_t iVar11;
  bool bVar12;
  
  pdVar1 = vdata->data;
  iVar11 = 0;
  while (count != 0) {
    uVar7 = 0x400 - this->vector_idx;
    if (count <= uVar7) {
      uVar7 = count;
    }
    if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      pSVar4 = vdata->sel;
      lVar10 = 0;
      iVar6 = iVar11;
      uVar8 = uVar7;
      while (bVar12 = uVar8 != 0, uVar8 = uVar8 - 1, bVar12) {
        psVar2 = pSVar4->sel_vector;
        iVar9 = iVar6;
        if (psVar2 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar2[iVar6];
        }
        this->input_vector[this->vector_idx + lVar10] = *(EXACT_TYPE *)(pdVar1 + iVar9 * 8);
        lVar10 = lVar10 + 1;
        iVar6 = iVar6 + 1;
      }
    }
    else {
      lVar10 = 0;
      iVar6 = iVar11;
      uVar8 = uVar7;
      while (bVar12 = uVar8 != 0, uVar8 = uVar8 - 1, bVar12) {
        psVar2 = vdata->sel->sel_vector;
        iVar9 = iVar6;
        if (psVar2 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar2[iVar6];
        }
        EVar3 = *(EXACT_TYPE *)(pdVar1 + iVar9 * 8);
        bVar12 = TemplatedValidityMask<unsigned_long>::RowIsValid
                           (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,iVar9);
        lVar5 = this->vector_idx + lVar10;
        iVar9 = this->nulls_idx;
        this->vector_null_positions[iVar9] = (uint16_t)lVar5;
        this->nulls_idx = !bVar12 + iVar9;
        this->input_vector[lVar5] = EVar3;
        lVar10 = lVar10 + 1;
        iVar6 = iVar6 + 1;
      }
    }
    iVar11 = iVar11 + uVar7;
    count = count - uVar7;
    iVar6 = uVar7 + this->vector_idx;
    this->vector_idx = iVar6;
    if (iVar6 == 0x400) {
      CompressVector(this);
    }
  }
  return;
}

Assistant:

void Append(UnifiedVectorFormat &vdata, idx_t count) {
		auto data = UnifiedVectorFormat::GetData<T>(vdata);
		idx_t values_left_in_data = count;
		idx_t offset_in_data = 0;
		while (values_left_in_data > 0) {
			// We calculate until which value in data we must go to fill the input_vector
			// to avoid checking if input_vector is filled in each iteration
			auto values_to_fill_alp_input =
			    MinValue<idx_t>(AlpConstants::ALP_VECTOR_SIZE - vector_idx, values_left_in_data);
			if (vdata.validity.AllValid()) { //! We optimize a loop when there are no null
				for (idx_t i = 0; i < values_to_fill_alp_input; i++) {
					auto idx = vdata.sel->get_index(offset_in_data + i);
					EXACT_TYPE value = Load<EXACT_TYPE>(const_data_ptr_cast(&data[idx]));
					input_vector[vector_idx + i] = value;
				}
			} else {
				for (idx_t i = 0; i < values_to_fill_alp_input; i++) {
					auto idx = vdata.sel->get_index(offset_in_data + i);
					EXACT_TYPE value = Load<EXACT_TYPE>(const_data_ptr_cast(&data[idx]));
					bool is_null = !vdata.validity.RowIsValid(idx);
					//! We resolve null values with a predicated comparison
					vector_null_positions[nulls_idx] = UnsafeNumericCast<uint16_t>(vector_idx + i);
					nulls_idx += is_null;
					input_vector[vector_idx + i] = value;
				}
			}
			offset_in_data += values_to_fill_alp_input;
			values_left_in_data -= values_to_fill_alp_input;
			vector_idx += values_to_fill_alp_input;
			// We still need this check since we could have an incomplete input_vector at the end of data
			if (vector_idx == AlpConstants::ALP_VECTOR_SIZE) {
				CompressVector();
				D_ASSERT(vector_idx == 0);
			}
		}
	}